

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

bool __thiscall pbrt::Image::WriteEXR(Image *this,string *name,ImageMetadata *metadata)

{
  optional<pbrt::Bounds2<int>_> *this_00;
  Tuple2<pbrt::Point2,_int> *pTVar1;
  bool bVar2;
  int iVar3;
  Point2<int> *pPVar4;
  Bounds2<int> *pBVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  char *pcVar8;
  float *pfVar9;
  SquareMatrix<4> *pSVar10;
  int *value;
  _Base_ptr p_Var11;
  RGBColorSpace *pRVar12;
  int i;
  long lVar13;
  int j;
  long lVar14;
  int iVar15;
  float (*pafVar16) [4];
  int iVar17;
  long lVar18;
  Box2i local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  OutputFile file;
  float fStack_1d4;
  Header header;
  Tuple2<pbrt::Point2,_float> local_100;
  Tuple2<pbrt::Point2,_float> local_f8;
  FrameBuffer fb;
  ColorEncodingHandle local_c0;
  float m [4] [4];
  Tuple2<pbrt::Point2,_float> local_78;
  float afStack_70 [2];
  float afStack_68 [2];
  float afStack_60 [2];
  float afStack_58 [2];
  float afStack_50 [2];
  float afStack_48 [2];
  float afStack_40 [4];
  
  if (this->format - Half < 2) {
    local_1e8 = 0x7fffffff7fffffff;
    uStack_1e0 = 0x8000000080000000;
    local_1f8.min.x = 0x7fffffff;
    local_1f8.min.y = 0x7fffffff;
    local_1f8.max.x = -0x80000000;
    local_1f8.max.y = -0x80000000;
    if ((metadata->fullResolution).set == true) {
      pPVar4 = pstd::optional<pbrt::Point2<int>_>::value(&metadata->fullResolution);
      iVar3 = (pPVar4->super_Tuple2<pbrt::Point2,_int>).x;
      pPVar4 = pstd::optional<pbrt::Point2<int>_>::value(&metadata->fullResolution);
      pTVar1 = &pPVar4->super_Tuple2<pbrt::Point2,_int>;
    }
    else {
      iVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      pTVar1 = &(this->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    local_1e8 = 0;
    uStack_1e0 = CONCAT44(pTVar1->y + -1,iVar3 + -1);
    if ((metadata->pixelBounds).set == true) {
      this_00 = &metadata->pixelBounds;
      pBVar5 = pstd::optional<pbrt::Bounds2<int>_>::value(this_00);
      iVar3 = (pBVar5->pMin).super_Tuple2<pbrt::Point2,_int>.x;
      pBVar5 = pstd::optional<pbrt::Bounds2<int>_>::value(this_00);
      iVar15 = (pBVar5->pMin).super_Tuple2<pbrt::Point2,_int>.y;
      pBVar5 = pstd::optional<pbrt::Bounds2<int>_>::value(this_00);
      iVar17 = (pBVar5->pMax).super_Tuple2<pbrt::Point2,_int>.x;
      pBVar5 = pstd::optional<pbrt::Bounds2<int>_>::value(this_00);
      pPVar4 = &pBVar5->pMax;
    }
    else {
      iVar17 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      pPVar4 = &this->resolution;
      iVar3 = 0;
      iVar15 = 0;
    }
    local_1f8.min.y = iVar15;
    local_1f8.min.x = iVar3;
    local_1f8.max.y = (pPVar4->super_Tuple2<pbrt::Point2,_int>).y + -1;
    local_1f8.max.x = iVar17 + -1;
    AllChannelsDesc((ImageChannelDesc *)&file,this);
    imageToFrameBuffer(&fb,this,(ImageChannelDesc *)&file,&local_1f8);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&file);
    _file = 0.0;
    fStack_1d4 = 0.0;
    Imf_2_5::Header::Header((Header *)0x3f800000,0x3f800000,&header,&local_1e8,&local_1f8,&file,0,3)
    ;
    p_Var6 = (_Rb_tree_node_base *)Imf_2_5::FrameBuffer::begin();
    while( true ) {
      p_Var7 = (_Rb_tree_node_base *)Imf_2_5::FrameBuffer::end();
      if (p_Var6 == p_Var7) break;
      pcVar8 = (char *)Imf_2_5::Header::channels();
      Imf_2_5::Channel::Channel((Channel *)&file,p_Var6[9]._M_color,1,1,false);
      Imf_2_5::ChannelList::insert(pcVar8,(Channel *)(p_Var6 + 1));
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    }
    if ((metadata->renderTimeSeconds).set != false) {
      pfVar9 = pstd::optional<float>::value(&metadata->renderTimeSeconds);
      Imf_2_5::TypedAttribute<float>::TypedAttribute((TypedAttribute<float> *)&file,pfVar9);
      Imf_2_5::Header::insert((char *)&header,(Attribute *)"renderTimeSeconds");
      Imf_2_5::Attribute::~Attribute((Attribute *)&file);
    }
    if ((metadata->cameraFromWorld).set == true) {
      pafVar16 = m;
      lVar18 = 0;
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          pSVar10 = pstd::optional<pbrt::SquareMatrix<4>_>::value(&metadata->cameraFromWorld);
          (*pafVar16)[lVar14] = *(float *)((long)pSVar10->m[0] + lVar14 * 4 + lVar18);
        }
        pafVar16 = pafVar16 + 1;
        lVar18 = lVar18 + 0x10;
      }
      local_78.x = m[0][0];
      local_78.y = m[0][1];
      afStack_70[0] = m[0][2];
      afStack_70[1] = m[0][3];
      afStack_68[0] = m[1][0];
      afStack_68[1] = m[1][1];
      afStack_60[0] = m[1][2];
      afStack_60[1] = m[1][3];
      afStack_58[0] = m[2][0];
      afStack_58[1] = m[2][1];
      afStack_50[0] = m[2][2];
      afStack_50[1] = m[2][3];
      afStack_48[0] = m[3][0];
      afStack_48[1] = m[3][1];
      afStack_40[0] = m[3][2];
      afStack_40[1] = m[3][3];
      Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_2_5::Matrix44<float>_> *)&file,(Matrix44<float> *)&local_78);
      Imf_2_5::Header::insert((char *)&header,(Attribute *)"worldToCamera");
      Imf_2_5::Attribute::~Attribute((Attribute *)&file);
    }
    if ((metadata->NDCFromWorld).set == true) {
      pafVar16 = m;
      lVar18 = 0;
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          pSVar10 = pstd::optional<pbrt::SquareMatrix<4>_>::value(&metadata->NDCFromWorld);
          (*pafVar16)[lVar14] = *(float *)((long)pSVar10->m[0] + lVar14 * 4 + lVar18);
        }
        pafVar16 = pafVar16 + 1;
        lVar18 = lVar18 + 0x10;
      }
      local_78.x = m[0][0];
      local_78.y = m[0][1];
      afStack_70[0] = m[0][2];
      afStack_70[1] = m[0][3];
      afStack_68[0] = m[1][0];
      afStack_68[1] = m[1][1];
      afStack_60[0] = m[1][2];
      afStack_60[1] = m[1][3];
      afStack_58[0] = m[2][0];
      afStack_58[1] = m[2][1];
      afStack_50[0] = m[2][2];
      afStack_50[1] = m[2][3];
      afStack_48[0] = m[3][0];
      afStack_48[1] = m[3][1];
      afStack_40[0] = m[3][2];
      afStack_40[1] = m[3][3];
      Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_2_5::Matrix44<float>_> *)&file,(Matrix44<float> *)&local_78);
      Imf_2_5::Header::insert((char *)&header,(Attribute *)"worldToNDC");
      Imf_2_5::Attribute::~Attribute((Attribute *)&file);
    }
    if ((metadata->samplesPerPixel).set == true) {
      value = pstd::optional<int>::value(&metadata->samplesPerPixel);
      Imf_2_5::TypedAttribute<int>::TypedAttribute((TypedAttribute<int> *)&file,value);
      Imf_2_5::Header::insert((char *)&header,(Attribute *)"samplesPerPixel");
      Imf_2_5::Attribute::~Attribute((Attribute *)&file);
    }
    if ((metadata->MSE).set == true) {
      pfVar9 = pstd::optional<float>::value(&metadata->MSE);
      Imf_2_5::TypedAttribute<float>::TypedAttribute((TypedAttribute<float> *)&file,pfVar9);
      Imf_2_5::Header::insert((char *)&header,(Attribute *)"MSE");
      Imf_2_5::Attribute::~Attribute((Attribute *)&file);
    }
    for (p_Var11 = (metadata->stringVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &(metadata->stringVectors)._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      Imf_2_5::
      TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&file,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(p_Var11 + 2));
      Imf_2_5::Header::insert((string *)&header,(Attribute *)(p_Var11 + 1));
      Imf_2_5::
      TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&file);
    }
    pRVar12 = ImageMetadata::GetColorSpace(metadata);
    bVar2 = RGBColorSpace::operator!=(pRVar12,RGBColorSpace::sRGB);
    if (bVar2) {
      pRVar12 = ImageMetadata::GetColorSpace(metadata);
      _file = (pRVar12->r).super_Tuple2<pbrt::Point2,_float>;
      local_78 = (pRVar12->g).super_Tuple2<pbrt::Point2,_float>;
      local_f8 = (pRVar12->b).super_Tuple2<pbrt::Point2,_float>;
      local_100 = (pRVar12->w).super_Tuple2<pbrt::Point2,_float>;
      Imf_2_5::Chromaticities::Chromaticities
                ((Chromaticities *)m,(Vec2 *)&file,(Vec2 *)&local_78,(Vec2 *)&local_f8,
                 (Vec2 *)&local_100);
      Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::TypedAttribute
                ((TypedAttribute<Imf_2_5::Chromaticities> *)&file,(Chromaticities *)m);
      Imf_2_5::Header::insert((char *)&header,(Attribute *)"chromaticities");
      Imf_2_5::Attribute::~Attribute((Attribute *)&file);
    }
    pcVar8 = (name->_M_dataplus)._M_p;
    iVar3 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile(&file,pcVar8,&header,iVar3);
    Imf_2_5::OutputFile::setFrameBuffer((FrameBuffer *)&file);
    Imf_2_5::OutputFile::writePixels((int)&file);
    Imf_2_5::OutputFile::~OutputFile(&file);
    Imf_2_5::Header::~Header(&header);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&fb);
    bVar2 = true;
  }
  else {
    if (this->format != U256) {
      LogFatal<char_const(&)[35]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x444,"Check failed: %s",(char (*) [35])"Is16Bit(format) || Is32Bit(format)");
    }
    local_c0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    ConvertToFormat((Image *)&file,this,Half,&local_c0);
    bVar2 = WriteEXR((Image *)&file,name,metadata);
    ~Image((Image *)&file);
  }
  return bVar2;
}

Assistant:

bool Image::WriteEXR(const std::string &name, const ImageMetadata &metadata) const {
    if (Is8Bit(format))
        return ConvertToFormat(PixelFormat::Half).WriteEXR(name, metadata);
    CHECK(Is16Bit(format) || Is32Bit(format));

    try {
        Imath::Box2i displayWindow, dataWindow;
        if (metadata.fullResolution)
            // Agan, -1 offsets to handle inclusive indexing in OpenEXR...
            displayWindow = {Imath::V2i(0, 0),
                             Imath::V2i(metadata.fullResolution->x - 1,
                                        metadata.fullResolution->y - 1)};
        else
            displayWindow = {Imath::V2i(0, 0),
                             Imath::V2i(resolution.x - 1, resolution.y - 1)};

        if (metadata.pixelBounds)
            dataWindow = {
                Imath::V2i(metadata.pixelBounds->pMin.x, metadata.pixelBounds->pMin.y),
                Imath::V2i(metadata.pixelBounds->pMax.x - 1,
                           metadata.pixelBounds->pMax.y - 1)};
        else
            dataWindow = {Imath::V2i(0, 0),
                          Imath::V2i(resolution.x - 1, resolution.y - 1)};

        Imf::FrameBuffer fb = imageToFrameBuffer(*this, AllChannelsDesc(), dataWindow);

        Imf::Header header(displayWindow, dataWindow);
        for (auto iter = fb.begin(); iter != fb.end(); ++iter)
            header.channels().insert(iter.name(), iter.slice().type);

        if (metadata.renderTimeSeconds)
            header.insert("renderTimeSeconds",
                          Imf::FloatAttribute(*metadata.renderTimeSeconds));
        if (metadata.cameraFromWorld) {
            float m[4][4];
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    m[i][j] = (*metadata.cameraFromWorld)[i][j];
            header.insert("worldToCamera", Imf::M44fAttribute(m));
        }
        if (metadata.NDCFromWorld) {
            float m[4][4];
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    m[i][j] = (*metadata.NDCFromWorld)[i][j];
            header.insert("worldToNDC", Imf::M44fAttribute(m));
        }
        if (metadata.samplesPerPixel)
            header.insert("samplesPerPixel",
                          Imf::IntAttribute(*metadata.samplesPerPixel));
        if (metadata.MSE)
            header.insert("MSE", Imf::FloatAttribute(*metadata.MSE));
        for (const auto &iter : metadata.stringVectors)
            header.insert(iter.first, Imf::StringVectorAttribute(iter.second));

        // The OpenEXR spec says that the default is sRGB if no
        // chromaticities are provided.  It should be innocuous to write
        // the sRGB primaries anyway, but for completely indecipherable
        // reasons, OSX's Preview.app decides to gamma correct the pixels
        // in EXR files if it finds primaries.  So, we don't write them in
        // that case in the interests of nicer looking images on the
        // screen.
        if (*metadata.GetColorSpace() != *RGBColorSpace::sRGB) {
            const RGBColorSpace &cs = *metadata.GetColorSpace();
            Imf::Chromaticities chromaticities(
                Imath::V2f(cs.r.x, cs.r.y), Imath::V2f(cs.g.x, cs.g.y),
                Imath::V2f(cs.b.x, cs.b.y), Imath::V2f(cs.w.x, cs.w.y));
            header.insert("chromaticities", Imf::ChromaticitiesAttribute(chromaticities));
        }

        Imf::OutputFile file(name.c_str(), header);
        file.setFrameBuffer(fb);
        file.writePixels(resolution.y);
    } catch (const std::exception &exc) {
        Error("%s: error writing EXR: %s", name.c_str(), exc.what());
        return false;
    }

    return true;
}